

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

void __thiscall
Minisat::vec<Minisat::vec<Minisat::Solver::Watcher,_int>,_int>::capacity
          (vec<Minisat::vec<Minisat::Solver::Watcher,_int>,_int> *this,Size min_cap)

{
  Size SVar1;
  int iVar2;
  vec<Minisat::Solver::Watcher,_int> *pvVar3;
  int *piVar4;
  undefined8 uVar5;
  Size size_max;
  Size add;
  Size min_cap_local;
  vec<Minisat::vec<Minisat::Solver::Watcher,_int>,_int> *this_local;
  
  if (min_cap <= this->cap) {
    return;
  }
  SVar1 = max((min_cap - this->cap) + 1U & 0xfffffffe,(this->cap >> 1) + 2U & 0xfffffffe);
  if (SVar1 <= 0x7fffffff - this->cap) {
    iVar2 = SVar1 + this->cap;
    this->cap = iVar2;
    pvVar3 = (vec<Minisat::Solver::Watcher,_int> *)realloc(this->data,(long)iVar2 << 4);
    this->data = pvVar3;
    if (pvVar3 != (vec<Minisat::Solver::Watcher,_int> *)0x0) {
      return;
    }
    piVar4 = __errno_location();
    if (*piVar4 != 0xc) {
      return;
    }
  }
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&OutOfMemoryException::typeinfo,0);
}

Assistant:

void vec<T,_Size>::capacity(Size min_cap) {
    if (cap >= min_cap) return;
    Size add = max((min_cap - cap + 1) & ~1, ((cap >> 1) + 2) & ~1);   // NOTE: grow by approximately 3/2
    const Size size_max = std::numeric_limits<Size>::max();
    if ( ((size_max <= std::numeric_limits<int>::max()) && (add > size_max - cap))
    ||   (((data = (T*)::realloc(data, (cap += add) * sizeof(T))) == NULL) && errno == ENOMEM) )
        throw OutOfMemoryException();
 }